

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O1

void stbiw__write_hdr_scanline
               (stbi__write_context *s,int width,int ncomp,uchar *scratch,float *scanline)

{
  stbi__write_context *s_00;
  stbi__write_context *s_01;
  uchar *puVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  undefined8 uVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  undefined4 in_register_00000034;
  int iVar11;
  ulong uVar12;
  long lVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  uchar rgbe [4];
  uchar scanlineheader [4];
  undefined4 local_8c;
  ulong local_88;
  undefined8 local_80;
  long local_78;
  stbi__write_context *local_70;
  long local_68;
  uchar *local_60;
  undefined4 local_54;
  uchar *local_50;
  uchar *local_48;
  uint local_3c;
  char local_38 [4];
  char local_34 [4];
  
  local_54 = CONCAT22((ushort)width << 8 | (ushort)width >> 8,0x202);
  local_70 = s;
  local_50 = scratch;
  if (width - 0x8000U < 0xffff8008) {
    if (0 < width) {
      uVar12 = (ulong)(uint)width;
      do {
        if (ncomp - 3U < 2) {
          fVar15 = scanline[2];
          fVar17 = scanline[1];
          fVar18 = *scanline;
        }
        else {
          fVar15 = *scanline;
          fVar17 = fVar15;
          fVar18 = fVar15;
        }
        fVar14 = fVar17;
        if (fVar17 <= fVar15) {
          fVar14 = fVar15;
        }
        fVar16 = fVar18;
        if (fVar18 <= fVar14) {
          fVar16 = fVar14;
        }
        if (1e-32 <= fVar16) {
          local_80 = CONCAT44(local_80._4_4_,fVar15);
          local_60 = (uchar *)CONCAT44(local_60._4_4_,fVar17);
          local_68 = CONCAT44(local_68._4_4_,fVar18);
          local_88 = CONCAT44(local_88._4_4_,fVar16);
          fVar15 = frexpf(fVar16,(int *)local_38);
          fVar15 = (fVar15 * 256.0) / (float)local_88;
          local_8c = CONCAT13(local_38[0] + -0x80,
                              CONCAT12((char)(int)((float)local_80 * fVar15),
                                       CONCAT11((char)(int)(local_60._0_4_ * fVar15),
                                                (char)(int)((float)local_68 * fVar15))));
        }
        else {
          local_8c = 0;
        }
        (*local_70->func)(local_70->context,&local_8c,4);
        scanline = scanline + ncomp;
        uVar12 = uVar12 - 1;
      } while (uVar12 != 0);
    }
  }
  else {
    uVar4 = (ulong)(uint)width;
    uVar12 = uVar4;
    local_88 = uVar4;
    local_80 = CONCAT44(in_register_00000034,width);
    if (0 < width) {
      uVar8 = ncomp - 3;
      uVar7 = 0;
      local_3c = uVar8;
      do {
        if (uVar8 < 2) {
          fVar15 = scanline[2];
          fVar17 = scanline[1];
          fVar18 = *scanline;
        }
        else {
          fVar15 = *scanline;
          fVar17 = fVar15;
          fVar18 = fVar15;
        }
        fVar14 = fVar17;
        if (fVar17 <= fVar15) {
          fVar14 = fVar15;
        }
        fVar16 = fVar18;
        if (fVar18 <= fVar14) {
          fVar16 = fVar14;
        }
        if (1e-32 <= fVar16) {
          local_60 = (uchar *)CONCAT44(local_60._4_4_,fVar15);
          local_68 = CONCAT44(local_68._4_4_,fVar17);
          local_48 = (uchar *)CONCAT44(local_48._4_4_,fVar18);
          local_78 = CONCAT44(local_78._4_4_,fVar16);
          fVar15 = frexpf(fVar16,(int *)local_34);
          fVar15 = (fVar15 * 256.0) / (float)local_78;
          local_8c = CONCAT13(local_34[0] + -0x80,
                              CONCAT12((char)(int)(local_60._0_4_ * fVar15),
                                       CONCAT11((char)(int)((float)local_68 * fVar15),
                                                (char)(int)(local_48._0_4_ * fVar15))));
          uVar12 = local_88;
          uVar8 = local_3c;
        }
        else {
          local_8c = 0;
        }
        local_50[uVar7] = (uchar)local_8c;
        scratch[uVar7 + uVar4] = local_8c._1_1_;
        scratch[uVar7 + (uint)(width * 2)] = local_8c._2_1_;
        scratch[uVar7 + (uint)(width * 3)] = local_8c._3_1_;
        uVar7 = uVar7 + 1;
        scanline = scanline + ncomp;
      } while (uVar12 != uVar7);
    }
    (*local_70->func)(local_70->context,&local_54,4);
    lVar3 = uVar12 - 3;
    local_60 = local_50 + 2;
    local_78 = 0;
    local_48 = local_50;
    uVar5 = local_80;
    local_68 = lVar3;
    do {
      puVar1 = local_50;
      if (0 < (int)uVar5) {
        lVar13 = local_78 * local_88;
        iVar11 = 0;
        do {
          s_01 = local_70;
          iVar9 = (int)uVar5;
          s_00 = local_70;
          iVar10 = iVar9;
          if (iVar11 + 2 < iVar9) {
            lVar2 = (long)iVar11 + -1;
            iVar6 = iVar11;
            do {
              if ((local_60[lVar2 + -1] == local_60[lVar2]) &&
                 (iVar10 = iVar6, local_60[lVar2 + -1] == local_60[lVar2 + 1])) break;
              iVar6 = iVar6 + 1;
              lVar2 = lVar2 + 1;
              iVar10 = iVar9;
            } while (lVar2 < lVar3);
          }
          for (; local_70 = s_00, iVar11 < iVar10; iVar11 = iVar11 + iVar9) {
            iVar9 = iVar10 - iVar11;
            if (0x7f < iVar9) {
              iVar9 = 0x80;
            }
            stbiw__write_dump_data(s_01,iVar9,puVar1 + iVar11 + lVar13);
            s_00 = local_70;
          }
          iVar9 = (int)local_80;
          if (iVar10 + 2 < iVar9) {
            lVar3 = (long)iVar10;
            iVar6 = iVar10 + 1;
            if (iVar10 + 1 < iVar9) {
              iVar6 = iVar9;
            }
            do {
              if (local_48[lVar3] != puVar1[iVar11 + lVar13]) {
                iVar6 = (int)lVar3;
                break;
              }
              lVar3 = lVar3 + 1;
            } while (lVar3 < (long)local_88);
            for (; iVar11 < iVar6; iVar11 = iVar11 + iVar10) {
              iVar10 = iVar6 - iVar11;
              if (0x7e < iVar10) {
                iVar10 = 0x7f;
              }
              stbiw__write_run_data(s_00,iVar10,puVar1[iVar11 + lVar13]);
            }
          }
          uVar5 = local_80;
          lVar3 = local_68;
        } while (iVar11 < (int)local_80);
      }
      local_78 = local_78 + 1;
      local_60 = local_60 + local_88;
      local_48 = local_48 + local_88;
    } while (local_78 != 4);
  }
  return;
}

Assistant:

void stbiw__write_hdr_scanline(stbi__write_context *s, int width, int ncomp,
                               unsigned char *scratch, float *scanline) {
  unsigned char scanlineheader[4] = {2, 2, 0, 0};
  unsigned char rgbe[4];
  float linear[3];
  int x;

  scanlineheader[2] = (width & 0xff00) >> 8;
  scanlineheader[3] = (width & 0x00ff);

  /* skip RLE for images too small or large */
  if (width < 8 || width >= 32768) {
    for (x = 0; x < width; x++) {
      switch (ncomp) {
        case 4: /* fallthrough */
        case 3:
          linear[2] = scanline[x * ncomp + 2];
          linear[1] = scanline[x * ncomp + 1];
          linear[0] = scanline[x * ncomp + 0];
          break;
        default:
          linear[0] = linear[1] = linear[2] = scanline[x * ncomp + 0];
          break;
      }
      stbiw__linear_to_rgbe(rgbe, linear);
      s->func(s->context, rgbe, 4);
    }
  } else {
    int c, r;
    /* encode into scratch buffer */
    for (x = 0; x < width; x++) {
      switch (ncomp) {
        case 4: /* fallthrough */
        case 3:
          linear[2] = scanline[x * ncomp + 2];
          linear[1] = scanline[x * ncomp + 1];
          linear[0] = scanline[x * ncomp + 0];
          break;
        default:
          linear[0] = linear[1] = linear[2] = scanline[x * ncomp + 0];
          break;
      }
      stbiw__linear_to_rgbe(rgbe, linear);
      scratch[x + width * 0] = rgbe[0];
      scratch[x + width * 1] = rgbe[1];
      scratch[x + width * 2] = rgbe[2];
      scratch[x + width * 3] = rgbe[3];
    }

    s->func(s->context, scanlineheader, 4);

    /* RLE each component separately */
    for (c = 0; c < 4; c++) {
      unsigned char *comp = &scratch[width * c];

      x = 0;
      while (x < width) {
        // find first run
        r = x;
        while (r + 2 < width) {
          if (comp[r] == comp[r + 1] && comp[r] == comp[r + 2]) break;
          ++r;
        }
        if (r + 2 >= width) r = width;
        // dump up to first run
        while (x < r) {
          int len = r - x;
          if (len > 128) len = 128;
          stbiw__write_dump_data(s, len, &comp[x]);
          x += len;
        }
        // if there's a run, output it
        if (r + 2 < width) {  // same test as what we break out of in search
                              // loop, so only true if we break'd
          // find next byte after run
          while (r < width && comp[r] == comp[x]) ++r;
          // output run up to r
          while (x < r) {
            int len = r - x;
            if (len > 127) len = 127;
            stbiw__write_run_data(s, len, comp[x]);
            x += len;
          }
        }
      }
    }
  }
}